

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_cleanup(archive_read *a)

{
  archive_read *a_00;
  
  a_00 = (archive_read *)a->format->data;
  free_codes(a_00);
  free((void *)(a_00->archive).error_string.length);
  free((void *)(a_00->archive).error_string.buffer_length);
  free((a_00->client).dataset);
  free((a_00->client).closer);
  free(a_00->bidders[0xc].data);
  Ppmd7_Free((CPpmd7 *)&a_00->bidders[0xd].options);
  free(a_00);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_rar_cleanup(struct archive_read *a)
{
  struct rar *rar;

  rar = (struct rar *)(a->format->data);
  free_codes(a);
  free(rar->filename);
  free(rar->filename_save);
  free(rar->dbo);
  free(rar->unp_buffer);
  free(rar->lzss.window);
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  free(rar);
  (a->format->data) = NULL;
  return (ARCHIVE_OK);
}